

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curi.c
# Opt level: O0

curi_status curi_parse_path(char *path,size_t len,curi_settings *settings,void *userData)

{
  char *pcVar1;
  undefined1 local_c0 [8];
  curi_settings defaultSettings;
  size_t sStack_30;
  curi_status status;
  size_t offset;
  void *userData_local;
  curi_settings *settings_local;
  size_t len_local;
  char *path_local;
  
  sStack_30 = 0;
  offset = (size_t)userData;
  userData_local = settings;
  settings_local = (curi_settings *)len;
  len_local = (size_t)path;
  if (settings == (curi_settings *)0x0) {
    curi_default_settings((curi_settings *)local_c0);
    defaultSettings._132_4_ =
         parse_path((char *)len_local,(size_t)settings_local,&stack0xffffffffffffffd0,
                    (curi_settings *)local_c0,(void *)offset);
  }
  else {
    defaultSettings._132_4_ = parse_path(path,len,&stack0xffffffffffffffd0,settings,userData);
  }
  if (defaultSettings._132_4_ == 0) {
    pcVar1 = read_char((char *)len_local,(size_t)settings_local,&stack0xffffffffffffffd0);
    if (*pcVar1 != '\0') {
      defaultSettings._132_4_ = 2;
    }
  }
  return defaultSettings._132_4_;
}

Assistant:

curi_status curi_parse_path(const char* path, size_t len, const curi_settings* settings /*= 0*/, void* userData /*= 0*/)
{
    size_t offset = 0;
    curi_status status;

    if (settings)
    {
        // parsing with the given settings
        status = parse_path(path, len, &offset, settings, userData);
    }
    else
    {
        curi_settings defaultSettings;
        curi_default_settings(&defaultSettings);
        // parsing with default settings
        status = parse_path(path, len, &offset, &defaultSettings, userData);
    }

    if (status == curi_status_success && *read_char(path, len, &offset) != '\0')
        // the imput weren't fully consumed
        // TODO: set an error string somewhere
        status = curi_status_error;

    return status;
}